

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

bool __thiscall wasm::I64ToI32Lowering::unaryNeedsLowering(I64ToI32Lowering *this,UnaryOp op)

{
  UnaryOp op_local;
  I64ToI32Lowering *this_local;
  
  if (((((op == ClzInt64) || (op == CtzInt64)) || (op == PopcntInt64)) ||
      ((((op - EqZInt64 < 4 || (op == TruncSFloat32ToInt64)) ||
        ((op == TruncUFloat32ToInt64 ||
         ((op == TruncSFloat64ToInt64 || (op == TruncUFloat64ToInt64)))))) ||
       (op == ReinterpretFloat64)))) ||
     (((op - ConvertSInt64ToFloat32 < 4 || (op == ReinterpretInt64)) || (op - ExtendS8Int64 < 3))))
  {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool unaryNeedsLowering(UnaryOp op) {
    switch (op) {
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
      case EqZInt64:
      case ExtendSInt32:
      case ExtendUInt32:
      case WrapInt64:
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64:
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64:
      case ReinterpretFloat64:
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
      case ReinterpretInt64:
      case ExtendS8Int64:
      case ExtendS16Int64:
      case ExtendS32Int64:
        return true;
      default:
        return false;
    }
  }